

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * arena_bin_malloc_no_fresh_slab(tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind)

{
  _Bool _Var1;
  void *pvVar2;
  edata_t *slab;
  
  slab = (edata_t *)(arena->stats).mutex_prof_data[0].tot_wait_time.ns;
  if ((slab == (edata_t *)0x0) || ((slab->e_bits & 0x3ff0000000) == 0)) {
    _Var1 = arena_bin_refill_slabcur_no_fresh_slab(tsdn,arena,bin);
    if (_Var1) {
      return (void *)0x0;
    }
    slab = (edata_t *)(arena->stats).mutex_prof_data[0].tot_wait_time.ns;
  }
  pvVar2 = arena_slab_reg_alloc(slab,duckdb_je_bin_infos + ((ulong)bin & 0xffffffff));
  return pvVar2;
}

Assistant:

static void *
arena_bin_malloc_no_fresh_slab(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind) {
	malloc_mutex_assert_owner(tsdn, &bin->lock);
	if (bin->slabcur == NULL || edata_nfree_get(bin->slabcur) == 0) {
		if (arena_bin_refill_slabcur_no_fresh_slab(tsdn, arena, bin)) {
			return NULL;
		}
	}

	assert(bin->slabcur != NULL && edata_nfree_get(bin->slabcur) > 0);
	return arena_slab_reg_alloc(bin->slabcur, &bin_infos[binind]);
}